

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NodeDelayTraceArrival(Abc_Obj_t *pNode,Vec_Int_t *vSlacks)

{
  int iVar1;
  Mio_PinPhase_t MVar2;
  Abc_Time_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Time_t *pAVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float local_50;
  int local_4c;
  float Slack;
  int i;
  Mio_Pin_t *pPin;
  Mio_PinPhase_t PinPhase;
  float tDelayBlockFall;
  float tDelayBlockRise;
  Abc_Time_t *pTimeOut;
  Abc_Time_t *pTimeIn;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vSlacks_local;
  Abc_Obj_t *pNode_local;
  
  pAVar3 = Abc_NodeArrival(pNode);
  pAVar3->Fall = -1e+09;
  pAVar3->Rise = -1e+09;
  iVar1 = Abc_ObjIsBarBuf(pNode);
  if (iVar1 == 0) {
    _Slack = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
    for (local_4c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_4c < iVar1; local_4c = local_4c + 1) {
      pAVar4 = Abc_ObjFanin(pNode,local_4c);
      pAVar5 = Abc_NodeArrival(pAVar4);
      MVar2 = Mio_PinReadPhase(_Slack);
      dVar8 = Mio_PinReadDelayBlockRise(_Slack);
      fVar6 = (float)dVar8;
      dVar8 = Mio_PinReadDelayBlockFall(_Slack);
      fVar7 = (float)dVar8;
      if (MVar2 != MIO_PHASE_INV) {
        if (pAVar3->Rise < pAVar5->Rise + fVar6) {
          pAVar3->Rise = pAVar5->Rise + fVar6;
        }
        if (pAVar3->Fall < pAVar5->Fall + fVar7) {
          pAVar3->Fall = pAVar5->Fall + fVar7;
        }
      }
      if (MVar2 != MIO_PHASE_NONINV) {
        if (pAVar3->Rise < pAVar5->Fall + fVar6) {
          pAVar3->Rise = pAVar5->Fall + fVar6;
        }
        if (pAVar3->Fall < pAVar5->Rise + fVar7) {
          pAVar3->Fall = pAVar5->Rise + fVar7;
        }
      }
      _Slack = Mio_PinReadNext(_Slack);
    }
    if (vSlacks != (Vec_Int_t *)0x0) {
      _Slack = Mio_GateReadPins((Mio_Gate_t *)(pNode->field_5).pData);
      for (local_4c = 0; iVar1 = Abc_ObjFaninNum(pNode), local_4c < iVar1; local_4c = local_4c + 1)
      {
        pAVar4 = Abc_ObjFanin(pNode,local_4c);
        pAVar5 = Abc_NodeArrival(pAVar4);
        MVar2 = Mio_PinReadPhase(_Slack);
        dVar8 = Mio_PinReadDelayBlockRise(_Slack);
        dVar9 = Mio_PinReadDelayBlockFall(_Slack);
        local_50 = 1e+09;
        if (MVar2 != MIO_PHASE_INV) {
          fVar6 = Abc_AbsFloat((pAVar5->Rise + (float)dVar8) - pAVar3->Rise);
          fVar6 = Abc_MinFloat(1e+09,fVar6);
          fVar7 = Abc_AbsFloat((pAVar5->Fall + (float)dVar9) - pAVar3->Fall);
          local_50 = Abc_MinFloat(fVar6,fVar7);
        }
        if (MVar2 != MIO_PHASE_NONINV) {
          fVar6 = Abc_AbsFloat((pAVar5->Fall + (float)dVar8) - pAVar3->Rise);
          fVar6 = Abc_MinFloat(local_50,fVar6);
          fVar7 = Abc_AbsFloat((pAVar5->Rise + (float)dVar9) - pAVar3->Fall);
          local_50 = Abc_MinFloat(fVar6,fVar7);
        }
        _Slack = Mio_PinReadNext(_Slack);
        Abc_NtkDelayTraceSetSlack(vSlacks,pNode,local_4c,local_50);
      }
    }
  }
  else {
    pAVar4 = Abc_ObjFanin0(pNode);
    pAVar5 = Abc_NodeArrival(pAVar4);
    *pAVar3 = *pAVar5;
  }
  return;
}

Assistant:

void Abc_NodeDelayTraceArrival( Abc_Obj_t * pNode, Vec_Int_t * vSlacks )
{
    Abc_Obj_t * pFanin;
    Abc_Time_t * pTimeIn, * pTimeOut;
    float tDelayBlockRise, tDelayBlockFall;
    Mio_PinPhase_t PinPhase;
    Mio_Pin_t * pPin;
    int i;

    // start the arrival time of the node
    pTimeOut = Abc_NodeArrival(pNode);
    pTimeOut->Rise = pTimeOut->Fall = -ABC_INFINITY; 
    // consider the buffer
    if ( Abc_ObjIsBarBuf(pNode) )
    {
        pTimeIn = Abc_NodeArrival(Abc_ObjFanin0(pNode));
        *pTimeOut = *pTimeIn;
        return;
    }
    // go through the pins of the gate
    pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        pTimeIn = Abc_NodeArrival(pFanin);
        // get the interesting parameters of this pin
        PinPhase = Mio_PinReadPhase(pPin);
        tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
        tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
        // compute the arrival times of the positive phase
        if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Rise + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Rise + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Fall + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Fall + tDelayBlockFall;
        }
        if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
        {
            if ( pTimeOut->Rise < pTimeIn->Fall + tDelayBlockRise )
                pTimeOut->Rise = pTimeIn->Fall + tDelayBlockRise;
            if ( pTimeOut->Fall < pTimeIn->Rise + tDelayBlockFall )
                pTimeOut->Fall = pTimeIn->Rise + tDelayBlockFall;
        }
        pPin = Mio_PinReadNext(pPin);
    }

    // compute edge slacks
    if ( vSlacks )
    {
        float Slack;
        // go through the pins of the gate
        pPin = Mio_GateReadPins((Mio_Gate_t *)pNode->pData);
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            pTimeIn = Abc_NodeArrival(pFanin);
            // get the interesting parameters of this pin
            PinPhase = Mio_PinReadPhase(pPin);
            tDelayBlockRise = (float)Mio_PinReadDelayBlockRise( pPin );  
            tDelayBlockFall = (float)Mio_PinReadDelayBlockFall( pPin );  
            // compute the arrival times of the positive phase
            Slack = ABC_INFINITY;
            if ( PinPhase != MIO_PHASE_INV )  // NONINV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockFall - pTimeOut->Fall) );
            }
            if ( PinPhase != MIO_PHASE_NONINV )  // INV phase is present
            {
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Fall + tDelayBlockRise - pTimeOut->Rise) );
                Slack = Abc_MinFloat( Slack, Abc_AbsFloat(pTimeIn->Rise + tDelayBlockFall - pTimeOut->Fall) );
            }
            pPin = Mio_PinReadNext(pPin);
            Abc_NtkDelayTraceSetSlack( vSlacks, pNode, i, Slack );
        }
    }
}